

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::module<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  bool bVar2;
  Name *pNVar3;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_112;
  allocator<char> local_111;
  string local_110;
  Err local_f0;
  Err local_d0;
  Err *local_b0;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  undefined1 local_70 [8];
  MaybeResult<wasm::Ok> field;
  optional<wasm::Name> id;
  bool outer;
  ParseDeclsCtx *ctx_local;
  
  expected = sv("module",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    Lexer::takeID((optional<wasm::Name> *)
                  ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),&ctx->in);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional *)
                       ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (bVar2) {
      pNVar3 = std::optional<wasm::Name>::operator*
                         ((optional<wasm::Name> *)
                          ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      wasm::Name::operator=(&ctx->wasm->name,pNVar3);
    }
  }
  do {
    modulefield<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_70,ctx);
    bVar2 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_70);
    if (bVar2) {
      MaybeResult<wasm::Ok>::MaybeResult
                ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_70);
      local_b0 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
      bVar2 = local_b0 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_d0,local_b0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d0);
        wasm::Err::~Err(&local_d0);
      }
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_3_ = 0;
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = bVar2;
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ == 0) {
        _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_3_ = 0;
      }
    }
    else {
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\x03';
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_3_ = 0;
    }
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_70);
  } while (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ == 0);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_4_ != 1) {
    if ((!bVar1) || (bVar1 = Lexer::takeRParen(&ctx->in), bVar1)) {
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_112);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"expected end of module",&local_111);
      Lexer::err(&local_f0,&ctx->in,&local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
      wasm::Err::~Err(&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> module(Ctx& ctx) {
  bool outer = ctx.in.takeSExprStart("module"sv);

  if (outer) {
    if (auto id = ctx.in.takeID()) {
      ctx.wasm.name = *id;
    }
  }

  while (auto field = modulefield(ctx)) {
    CHECK_ERR(field);
  }

  if (outer && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of module");
  }

  return Ok{};
}